

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O3

void __thiscall
Matrix3f::Matrix3f(Matrix3f *this,Vector3f *v0,Vector3f *v1,Vector3f *v2,bool setColumns)

{
  undefined3 in_register_00000081;
  
  if (CONCAT31(in_register_00000081,setColumns) != 0) {
    setCol(this,0,v0);
    setCol(this,1,v1);
    setCol(this,2,v2);
    return;
  }
  setRow(this,0,v0);
  setRow(this,1,v1);
  setRow(this,2,v2);
  return;
}

Assistant:

Matrix3f::Matrix3f( const Vector3f& v0, const Vector3f& v1, const Vector3f& v2, bool setColumns )
{
	if( setColumns )
	{
		setCol( 0, v0 );
		setCol( 1, v1 );
		setCol( 2, v2 );
	}
	else
	{
		setRow( 0, v0 );
		setRow( 1, v1 );
		setRow( 2, v2 );
	}
}